

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

LogicalType * duckdb::DBConfig::ParseLogicalType(LogicalType *__return_storage_ptr__,string *type)

{
  long lVar1;
  LogicalType *pLVar2;
  pointer pcVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *ppVar4;
  bool bVar5;
  LogicalTypeId id;
  long lVar6;
  reference pvVar7;
  InternalException *pIVar8;
  idx_t index;
  int iVar9;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this;
  size_type sVar10;
  string map_args;
  LogicalType *type_id;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  map_args_vect;
  LogicalType value_type;
  LogicalType child_type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  union_member_parts;
  LogicalType value_type_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_320;
  LogicalType *local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2e0;
  LogicalType local_2c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_2a8;
  optional_idx local_270;
  child_list_t<LogicalType> local_268;
  child_list_t<LogicalType> local_250;
  LogicalType local_238;
  LogicalType local_220;
  LogicalType local_208;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
  local_2e8 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"[]","");
  bVar5 = StringUtil::EndsWith(type,&local_320.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.first._M_dataplus._M_p != &local_320.first.field_2) {
    operator_delete(local_320.first._M_dataplus._M_p);
  }
  if (bVar5) {
    ::std::__cxx11::string::substr((ulong)&local_320,(ulong)type);
    ParseLogicalType((LogicalType *)&local_2a8,&local_320.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320.first._M_dataplus._M_p != &local_320.first.field_2) {
      operator_delete(local_320.first._M_dataplus._M_p);
    }
    LogicalType::LIST(local_2e8,(LogicalType *)&local_2a8);
LAB_00fa6908:
    LogicalType::~LogicalType((LogicalType *)&local_2a8);
    return local_2e8;
  }
  local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"]","");
  bVar5 = StringUtil::EndsWith(type,&local_320.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.first._M_dataplus._M_p != &local_320.first.field_2) {
    operator_delete(local_320.first._M_dataplus._M_p);
  }
  if (bVar5) {
    lVar6 = ::std::__cxx11::string::rfind((char)type,0x5b);
    if (lVar6 + 1U < 2) {
      pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
      local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_320,"Ill formatted type: \'%s\'","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar3 = (type->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + type->_M_string_length);
      InternalException::InternalException<std::__cxx11::string>(pIVar8,&local_320.first,&local_50);
      __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (lVar6 + 1U < type->_M_string_length - 1) {
      index = 0;
      do {
        iVar9 = (int)(type->_M_dataplus)._M_p[lVar6 + 1];
        if (9 < iVar9 - 0x30U) {
          pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
          local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_320,"Ill formatted array type: \'%s\'","");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar3 = (type->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + type->_M_string_length);
          InternalException::InternalException<std::__cxx11::string>
                    (pIVar8,&local_320.first,&local_70);
          __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        lVar1 = (long)iVar9 + index * 10;
        index = lVar1 - 0x30;
        lVar6 = lVar6 + 1;
      } while (type->_M_string_length - 2 != lVar6);
      if (0xfffffffffffe795f < lVar1 - 0x186d1U) {
        ::std::__cxx11::string::substr((ulong)&local_320,(ulong)type);
        ParseLogicalType((LogicalType *)&local_2a8,&local_320.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320.first._M_dataplus._M_p != &local_320.first.field_2) {
          operator_delete(local_320.first._M_dataplus._M_p);
        }
        optional_idx::optional_idx(&local_270,index);
        LogicalType::ARRAY(local_2e8,(LogicalType *)&local_2a8,local_270);
        goto LAB_00fa6908;
      }
    }
    pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
    local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_320,"Invalid array size: \'%s\'","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar3 = (type->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + type->_M_string_length);
    InternalException::InternalException<std::__cxx11::string>(pIVar8,&local_320.first,&local_90);
    __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pcVar3 = (type->_M_dataplus)._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar3,pcVar3 + type->_M_string_length);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"MAP(","");
  bVar5 = StringUtil::StartsWith(&local_150,&local_170);
  if (bVar5) {
    local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,")","");
    bVar5 = StringUtil::EndsWith(type,&local_320.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320.first._M_dataplus._M_p != &local_320.first.field_2) {
      operator_delete(local_320.first._M_dataplus._M_p);
    }
  }
  else {
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (bVar5 == false) {
    pcVar3 = (type->_M_dataplus)._M_p;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,pcVar3,pcVar3 + type->_M_string_length);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"UNION(","");
    bVar5 = StringUtil::StartsWith(&local_190,&local_1b0);
    if (bVar5) {
      local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,")","");
      bVar5 = StringUtil::EndsWith(type,&local_320.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320.first._M_dataplus._M_p != &local_320.first.field_2) {
        operator_delete(local_320.first._M_dataplus._M_p);
      }
    }
    else {
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if (bVar5 == false) {
      pcVar3 = (type->_M_dataplus)._M_p;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,pcVar3,pcVar3 + type->_M_string_length);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"STRUCT(","");
      bVar5 = StringUtil::StartsWith(&local_1d0,&local_1f0);
      if (bVar5) {
        local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,")","");
        bVar5 = StringUtil::EndsWith(type,&local_320.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320.first._M_dataplus._M_p != &local_320.first.field_2) {
          operator_delete(local_320.first._M_dataplus._M_p);
        }
      }
      else {
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if (bVar5 == false) {
        local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"ANY","");
        bVar5 = StringUtil::CIEquals(type,&local_320.first);
        id = ANY;
        if (!bVar5) {
          id = TransformStringToLogicalTypeId(type);
        }
        LogicalType::LogicalType(local_2e8,id);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320.first._M_dataplus._M_p != &local_320.first.field_2) {
          operator_delete(local_320.first._M_dataplus._M_p);
        }
        LogicalType::LogicalType((LogicalType *)&local_320,USER);
        bVar5 = LogicalType::operator==(local_2e8,(LogicalType *)&local_320);
        LogicalType::~LogicalType((LogicalType *)&local_320);
        if (!bVar5) {
          return local_2e8;
        }
        pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
        local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_320,
                   "Error while generating extension function overloads - unrecognized logical type %s"
                   ,"");
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        pcVar3 = (type->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar3,pcVar3 + type->_M_string_length);
        InternalException::InternalException<std::__cxx11::string>
                  (pIVar8,&local_320.first,&local_130);
        __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::substr((ulong)&local_2a8,(ulong)type);
      StringUtil::SplitWithParentheses(&local_2e0,&local_2a8.first,',','(',')');
      local_2c8._0_8_ = (element_type *)0x0;
      local_2c8.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2c8.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_2e0.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_2e0.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar10 = 0;
        pLVar2 = &local_2a8.second;
        do {
          pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[](&local_2e0,sVar10);
          StringUtil::Trim(pvVar7);
          pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[](&local_2e0,sVar10);
          StringUtil::SplitWithParentheses
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)pLVar2,pvVar7,' ','(',')');
          if ((long)local_2a8.second.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
              local_2a8.second._0_8_ != 0x40) {
            pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
            local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_320,"Ill formatted struct type: %s","");
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            pcVar3 = (type->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,pcVar3,pcVar3 + type->_M_string_length);
            InternalException::InternalException<std::__cxx11::string>
                      (pIVar8,&local_320.first,&local_110);
            __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)pLVar2,0);
          StringUtil::Trim(pvVar7);
          pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)pLVar2,1);
          StringUtil::Trim(pvVar7);
          pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)pLVar2,1);
          ParseLogicalType(&local_238,pvVar7);
          pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)pLVar2,0);
          ::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                      *)&local_320,pvVar7,&local_238);
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
          ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                    ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                      *)&local_2c8,&local_320);
          LogicalType::~LogicalType(&local_320.second);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320.first._M_dataplus._M_p != &local_320.first.field_2) {
            operator_delete(local_320.first._M_dataplus._M_p);
          }
          LogicalType::~LogicalType(&local_238);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pLVar2);
          sVar10 = sVar10 + 1;
        } while (sVar10 < (ulong)((long)local_2e0.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_2e0.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)&local_268,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)&local_2c8);
      LogicalType::STRUCT(local_2e8,&local_268);
      this = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_268;
    }
    else {
      ::std::__cxx11::string::substr((ulong)&local_2a8,(ulong)type);
      StringUtil::SplitWithParentheses(&local_2e0,&local_2a8.first,',','(',')');
      local_2c8._0_8_ = (element_type *)0x0;
      local_2c8.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2c8.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_2e0.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_2e0.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
LAB_00fa748b:
        pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
        local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_320,"Invalid number of union members: \'%s\'","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        pcVar3 = (type->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar3,pcVar3 + type->_M_string_length);
        InternalException::InternalException<std::__cxx11::string>
                  (pIVar8,&local_320.first,&local_f0);
        __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      sVar10 = 0;
      pLVar2 = &local_2a8.second;
      do {
        pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[](&local_2e0,sVar10);
        StringUtil::Trim(pvVar7);
        pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[](&local_2e0,sVar10);
        StringUtil::SplitWithParentheses
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)pLVar2,pvVar7,' ','(',')');
        if ((long)local_2a8.second.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
            local_2a8.second._0_8_ != 0x40) {
          pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
          local_320.first._M_dataplus._M_p = (pointer)&local_320.first.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_320,"Ill formatted union type: %s","");
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          pcVar3 = (type->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar3,pcVar3 + type->_M_string_length);
          InternalException::InternalException<std::__cxx11::string>
                    (pIVar8,&local_320.first,&local_d0);
          __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)pLVar2,0);
        StringUtil::Trim(pvVar7);
        pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)pLVar2,1);
        StringUtil::Trim(pvVar7);
        pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)pLVar2,1);
        ParseLogicalType(&local_238,pvVar7);
        pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)pLVar2,0);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)&local_320,pvVar7,&local_238);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_2c8,&local_320);
        LogicalType::~LogicalType(&local_320.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320.first._M_dataplus._M_p != &local_320.first.field_2) {
          operator_delete(local_320.first._M_dataplus._M_p);
        }
        LogicalType::~LogicalType(&local_238);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pLVar2);
        sVar10 = sVar10 + 1;
      } while (sVar10 < (ulong)((long)local_2e0.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_2e0.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
      if (((element_type *)local_2c8._0_8_ ==
           local_2c8.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) ||
         (0x100 < (ulong)(((long)local_2c8.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr - local_2c8._0_8_ >> 3) * 0x6db6db6db6db6db7)))
      goto LAB_00fa748b;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)&local_250,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)&local_2c8);
      LogicalType::UNION(local_2e8,&local_250);
      this = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_250;
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector(this);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_2c8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2e0);
    ppVar4 = &local_2a8;
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_320,(ulong)type);
    StringUtil::SplitWithParentheses(&local_2e0,&local_320.first,',','(',')');
    if ((long)local_2e0.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_2e0.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
      local_2a8.first._M_dataplus._M_p = (pointer)&local_2a8.first.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,"Ill formatted map type: \'%s\'","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar3 = (type->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,pcVar3 + type->_M_string_length);
      InternalException::InternalException<std::__cxx11::string>(pIVar8,&local_2a8.first,&local_b0);
      __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](&local_2e0,0);
    StringUtil::Trim(pvVar7);
    pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](&local_2e0,1);
    StringUtil::Trim(pvVar7);
    pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](&local_2e0,0);
    ParseLogicalType((LogicalType *)&local_2a8,pvVar7);
    pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](&local_2e0,1);
    ParseLogicalType(&local_2c8,pvVar7);
    LogicalType::LogicalType(&local_208,(LogicalType *)&local_2a8);
    LogicalType::LogicalType(&local_220,&local_2c8);
    LogicalType::MAP(local_2e8,&local_208,&local_220);
    LogicalType::~LogicalType(&local_220);
    LogicalType::~LogicalType(&local_208);
    LogicalType::~LogicalType(&local_2c8);
    LogicalType::~LogicalType((LogicalType *)&local_2a8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2e0);
    ppVar4 = &local_320;
    local_2a8.first._M_dataplus._M_p = local_320.first._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p == &(ppVar4->first).field_2) {
    return local_2e8;
  }
  operator_delete(local_2a8.first._M_dataplus._M_p);
  return local_2e8;
}

Assistant:

LogicalType DBConfig::ParseLogicalType(const string &type) {
	if (StringUtil::EndsWith(type, "[]")) {
		// list - recurse
		auto child_type = ParseLogicalType(type.substr(0, type.size() - 2));
		return LogicalType::LIST(child_type);
	}

	if (StringUtil::EndsWith(type, "]")) {
		// array - recurse
		auto bracket_open_idx = type.rfind('[');
		if (bracket_open_idx == DConstants::INVALID_INDEX || bracket_open_idx == 0) {
			throw InternalException("Ill formatted type: '%s'", type);
		}
		idx_t array_size = 0;
		for (auto length_idx = bracket_open_idx + 1; length_idx < type.size() - 1; length_idx++) {
			if (!isdigit(type[length_idx])) {
				throw InternalException("Ill formatted array type: '%s'", type);
			}
			array_size = array_size * 10 + static_cast<idx_t>(type[length_idx] - '0');
		}
		if (array_size == 0 || array_size > ArrayType::MAX_ARRAY_SIZE) {
			throw InternalException("Invalid array size: '%s'", type);
		}
		auto child_type = ParseLogicalType(type.substr(0, bracket_open_idx));
		return LogicalType::ARRAY(child_type, array_size);
	}

	if (StringUtil::StartsWith(type, "MAP(") && StringUtil::EndsWith(type, ")")) {
		// map - recurse
		string map_args = type.substr(4, type.size() - 5);
		vector<string> map_args_vect = StringUtil::SplitWithParentheses(map_args);
		if (map_args_vect.size() != 2) {
			throw InternalException("Ill formatted map type: '%s'", type);
		}
		StringUtil::Trim(map_args_vect[0]);
		StringUtil::Trim(map_args_vect[1]);
		auto key_type = ParseLogicalType(map_args_vect[0]);
		auto value_type = ParseLogicalType(map_args_vect[1]);
		return LogicalType::MAP(key_type, value_type);
	}

	if (StringUtil::StartsWith(type, "UNION(") && StringUtil::EndsWith(type, ")")) {
		// union - recurse
		string union_members_str = type.substr(6, type.size() - 7);
		vector<string> union_members_vect = StringUtil::SplitWithParentheses(union_members_str);
		child_list_t<LogicalType> union_members;
		for (idx_t member_idx = 0; member_idx < union_members_vect.size(); member_idx++) {
			StringUtil::Trim(union_members_vect[member_idx]);
			vector<string> union_member_parts = StringUtil::SplitWithParentheses(union_members_vect[member_idx], ' ');
			if (union_member_parts.size() != 2) {
				throw InternalException("Ill formatted union type: %s", type);
			}
			StringUtil::Trim(union_member_parts[0]);
			StringUtil::Trim(union_member_parts[1]);
			auto value_type = ParseLogicalType(union_member_parts[1]);
			union_members.emplace_back(make_pair(union_member_parts[0], value_type));
		}
		if (union_members.empty() || union_members.size() > UnionType::MAX_UNION_MEMBERS) {
			throw InternalException("Invalid number of union members: '%s'", type);
		}
		return LogicalType::UNION(union_members);
	}

	if (StringUtil::StartsWith(type, "STRUCT(") && StringUtil::EndsWith(type, ")")) {
		// struct - recurse
		string struct_members_str = type.substr(7, type.size() - 8);
		vector<string> struct_members_vect = StringUtil::SplitWithParentheses(struct_members_str);
		child_list_t<LogicalType> struct_members;
		for (idx_t member_idx = 0; member_idx < struct_members_vect.size(); member_idx++) {
			StringUtil::Trim(struct_members_vect[member_idx]);
			vector<string> struct_member_parts = StringUtil::SplitWithParentheses(struct_members_vect[member_idx], ' ');
			if (struct_member_parts.size() != 2) {
				throw InternalException("Ill formatted struct type: %s", type);
			}
			StringUtil::Trim(struct_member_parts[0]);
			StringUtil::Trim(struct_member_parts[1]);
			auto value_type = ParseLogicalType(struct_member_parts[1]);
			struct_members.emplace_back(make_pair(struct_member_parts[0], value_type));
		}
		return LogicalType::STRUCT(struct_members);
	}

	LogicalType type_id = StringUtil::CIEquals(type, "ANY") ? LogicalType::ANY : TransformStringToLogicalTypeId(type);
	if (type_id == LogicalTypeId::USER) {
		throw InternalException("Error while generating extension function overloads - unrecognized logical type %s",
		                        type);
	}
	return type_id;
}